

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

acttab * acttab_alloc(void)

{
  acttab *paVar1;
  
  paVar1 = (acttab *)calloc(1,0x30);
  if (paVar1 != (acttab *)0x0) {
    return paVar1;
  }
  fwrite("Unable to allocate memory for a new acttab.",0x2b,1,_stderr);
  exit(1);
}

Assistant:

acttab *acttab_alloc(void){
  acttab *p = (acttab *) calloc( 1, sizeof(*p) );
  if( p==0 ){
    fprintf(stderr,"Unable to allocate memory for a new acttab.");
    exit(1);
  }
  memset(p, 0, sizeof(*p));
  return p;
}